

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void kratos::PortPackedVisitor::add_struct
               (PackedStructGraph *g,PackedStruct *s,PackedStruct *parent)

{
  pointer pPVar1;
  PackedStructNode *pPVar2;
  PackedStructFieldDef *attr;
  pointer pPVar3;
  PackedStructNode *local_30;
  PackedStructNode *n;
  
  pPVar2 = PackedStructGraph::get_node(g,parent);
  local_30 = PackedStructGraph::get_node(g,s);
  if (local_30 != (PackedStructNode *)0x0) {
    local_30->parent = pPVar2;
    std::
    _Rb_tree<kratos::PackedStructNode*,kratos::PackedStructNode*,std::_Identity<kratos::PackedStructNode*>,std::less<kratos::PackedStructNode*>,std::allocator<kratos::PackedStructNode*>>
    ::_M_emplace_unique<kratos::PackedStructNode*&>
              ((_Rb_tree<kratos::PackedStructNode*,kratos::PackedStructNode*,std::_Identity<kratos::PackedStructNode*>,std::less<kratos::PackedStructNode*>,std::allocator<kratos::PackedStructNode*>>
                *)&pPVar2->children,&local_30);
  }
  pPVar1 = (parent->attributes).
           super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar3 = (parent->attributes).
                super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar3 != pPVar1; pPVar3 = pPVar3 + 1) {
    if (pPVar3->struct_ != (PackedStruct *)0x0) {
      add_struct(g,parent,pPVar3->struct_);
    }
  }
  return;
}

Assistant:

static void add_struct(PackedStructGraph* g, const PackedStruct* s,
                           const PackedStruct* parent) {
        auto* parent_node = g->get_node(parent);
        auto* n = g->get_node(s);
        if (n) {
            n->parent = parent_node;
            parent_node->children.emplace(n);
        }

        // look for child definition
        for (auto const& attr : parent->attributes) {
            if (attr.struct_) {
                add_struct(g, parent, attr.struct_);
            }
        }
    }